

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O0

string * __thiscall
Kraken::KClient::private_method
          (string *__return_storage_ptr__,KClient *this,string *method,KInput *input)

{
  CURL *pCVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ostream *poVar6;
  char *pcVar7;
  runtime_error *this_00;
  string local_360 [32];
  ostringstream local_340 [8];
  ostringstream oss;
  CURLcode result;
  undefined1 local_1a0 [8];
  string sign_header;
  string key_header;
  curl_slist *chunk;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  string postdata;
  string nonce;
  string method_url;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string path;
  KInput *input_local;
  string *method_local;
  KClient *this_local;
  string *response;
  
  path.field_2._8_8_ = input;
  std::operator+(&local_88,"/",&this->version_);
  std::operator+(&local_68,&local_88,"/private/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,method);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&nonce.field_2 + 8),&this->url_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  pCVar1 = this->curl_;
  uVar4 = std::__cxx11::string::c_str();
  curl_easy_setopt(pCVar1,0x2712,uVar4);
  create_nonce_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                 "nonce=",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&postdata.field_2 + 8));
  bVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)path.field_2._8_8_);
  if (!bVar2) {
    std::operator+(&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,"&"
                  );
    build_query((string *)&chunk,(KInput *)path.field_2._8_8_);
    std::operator+(&local_118,&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&chunk);
    std::__cxx11::string::operator=((string *)local_f8,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&chunk);
    std::__cxx11::string::~string((string *)&local_138);
  }
  pCVar1 = this->curl_;
  uVar4 = std::__cxx11::string::c_str();
  curl_easy_setopt(pCVar1,0x271f,uVar4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&sign_header.field_2 + 8),"API-Key: ",&this->key_);
  signature((string *)&result,this,(string *)local_48,(string *)((long)&postdata.field_2 + 8),
            (string *)local_f8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                 "API-Sign: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result);
  std::__cxx11::string::~string((string *)&result);
  uVar4 = std::__cxx11::string::c_str();
  uVar4 = curl_slist_append(0,uVar4);
  uVar5 = std::__cxx11::string::c_str();
  uVar4 = curl_slist_append(uVar4,uVar5);
  curl_easy_setopt(this->curl_,0x2727,uVar4);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  curl_easy_setopt(this->curl_,0x2711,__return_storage_ptr__);
  iVar3 = curl_easy_perform(this->curl_);
  curl_slist_free_all(uVar4);
  if (iVar3 == 0) {
    std::__cxx11::string::~string((string *)local_1a0);
    std::__cxx11::string::~string((string *)(sign_header.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::~string((string *)(postdata.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(nonce.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_48);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream(local_340);
  poVar6 = std::operator<<((ostream *)local_340,"curl_easy_perform() failed: ");
  pcVar7 = (char *)curl_easy_strerror(iVar3);
  std::operator<<(poVar6,pcVar7);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_00,local_360);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string KClient::private_method(const std::string& method, 
				 const KInput& input) const
{   
   // build method URL
   std::string path = "/" + version_ + "/private/" + method;
   std::string method_url = url_ + path;

   curl_easy_setopt(curl_, CURLOPT_URL, method_url.c_str());

   // create a nonce and and postdata 
   std::string nonce = create_nonce();
   std::string postdata = "nonce=" + nonce;

   // if 'input' is not empty generate other postdata
   if (!input.empty())
      postdata = postdata + "&" + build_query(input);
   curl_easy_setopt(curl_, CURLOPT_POSTFIELDS, postdata.c_str());

   // add custom header
   curl_slist* chunk = NULL;

   std::string key_header =  "API-Key: "  + key_;
   std::string sign_header = "API-Sign: " + signature(path, nonce, postdata);

   chunk = curl_slist_append(chunk, key_header.c_str());
   chunk = curl_slist_append(chunk, sign_header.c_str());
   curl_easy_setopt(curl_, CURLOPT_HTTPHEADER, chunk);
   
   // where CURL write callback function stores the response
   std::string response;
   curl_easy_setopt(curl_, CURLOPT_WRITEDATA, static_cast<void*>(&response));

   // perform CURL request
   CURLcode result = curl_easy_perform(curl_);

   // free the custom headers
   curl_slist_free_all(chunk);
  
   // check perform result
   if (result != CURLE_OK) {
      std::ostringstream oss;
      oss << "curl_easy_perform() failed: " << curl_easy_strerror(result);
      throw std::runtime_error(oss.str());
   }
   
   return response;
}